

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O1

string * __thiscall
Downloader_libcurl::getFileNameFromURL
          (string *__return_storage_ptr__,Downloader_libcurl *this,string *downloadURL)

{
  char cVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  char *pcVar4;
  pointer pcVar5;
  uint uVar6;
  bool bVar7;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar6 = (uint)downloadURL->_M_string_length;
  while (uVar6 = uVar6 - 1, -1 < (int)uVar6) {
    cVar1 = (downloadURL->_M_dataplus)._M_p[uVar6 & 0x7fffffff];
    if (cVar1 == '/') {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      __n = __return_storage_ptr__->_M_string_length;
      bVar7 = true;
      if (__n == local_48) {
        if (__n == 0) goto LAB_00104b7e;
        iVar3 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,local_50,__n);
        bVar7 = iVar3 != 0;
      }
    }
    else {
LAB_00104b7e:
      bVar7 = false;
    }
    if ((cVar1 == '/') && (local_50 != local_40)) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar7) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar5 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar2 < pcVar5 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Downloader_libcurl::getFileNameFromURL(const std::string &downloadURL)
{
    std::string result = std::string("");
    for (int i = downloadURL.length() - 1; i >= 0; i--)
    {
        if (downloadURL[i] == '/' && result != std::string("")) break;
        result += downloadURL[i];
    }
    std::reverse(result.begin(), result.end());
    return result;
}